

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMatrix.cpp
# Opt level: O1

bool testMatrix(void)

{
  long *plVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  double dVar4;
  unsigned_long uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  unsigned_long dd;
  void *__s;
  double *pdVar9;
  char *pcVar10;
  double *pdVar11;
  double *__s2;
  void *pvVar12;
  ulong uVar13;
  unsigned_long uVar14;
  void *pvVar15;
  byte unaff_BPL;
  long lVar16;
  long lVar17;
  unsigned_long aa;
  long lVar18;
  char *pcVar19;
  void *pvVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  unsigned_long bb;
  long lVar24;
  long lVar25;
  ulong uVar26;
  unsigned_long uVar27;
  ulong uVar28;
  byte bVar29;
  bool bVar30;
  bool bVar31;
  double result;
  double dVar32;
  DNN_NUMERIC DVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ulong local_118;
  long local_100;
  TMatrix<double> local_f8;
  long local_a8;
  Matrix aa_1;
  
  uVar13 = 0;
  tfs::report_message("Info ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                      ,"localTestMatrix",0x13f,"Test Matrix - Start");
  __s = operator_new__(0xb40);
  memset(__s,0,0xb40);
LAB_0010effe:
  if (uVar13 < 0xb40) goto code_r0x0010f007;
  lVar16 = 0;
  lVar25 = 0;
  pvVar12 = __s;
  do {
    pvVar15 = pvVar12;
    lVar17 = 0;
    do {
      lVar24 = 0;
      pvVar20 = pvVar15;
      do {
        lVar23 = lVar25;
        lVar25 = lVar23 * 2 + 1;
        lVar18 = 0;
        do {
          plVar1 = (long *)((long)pvVar20 + lVar18 * 4);
          *plVar1 = *plVar1 + lVar25;
          lVar18 = lVar18 + 2;
          lVar25 = lVar25 + 4;
        } while (lVar18 != 0x1e);
        lVar24 = lVar24 + 1;
        pvVar20 = (void *)((long)pvVar20 + 0x78);
        lVar25 = lVar23 + 0x1e;
      } while (lVar24 != 4);
      pvVar15 = (void *)((long)pvVar15 + 0x1e0);
      lVar25 = lVar23 + 0x1e;
      bVar6 = lVar17 == 0;
      lVar17 = lVar17 + 1;
    } while (bVar6);
    lVar16 = lVar16 + 1;
    pvVar12 = (void *)((long)pvVar12 + 0x3c0);
    lVar25 = lVar23 + 0x1e;
  } while (lVar16 != 3);
  lVar16 = 0;
  lVar25 = 0;
  pvVar12 = __s;
  do {
    pvVar15 = pvVar12;
    lVar17 = 0;
    do {
      lVar24 = 0;
      pvVar20 = pvVar15;
      do {
        lVar18 = lVar25;
        lVar25 = 0;
        do {
          *(long *)((long)pvVar20 + lVar25 * 8) = lVar18 + lVar25;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 0xf);
        lVar24 = lVar24 + 1;
        pvVar20 = (void *)((long)pvVar20 + 0x78);
        lVar25 = lVar18 + 0xf;
      } while (lVar24 != 4);
      pvVar15 = (void *)((long)pvVar15 + 0x1e0);
      lVar25 = lVar18 + 0xf;
      bVar6 = lVar17 == 0;
      lVar17 = lVar17 + 1;
    } while (bVar6);
    lVar16 = lVar16 + 1;
    pvVar12 = (void *)((long)pvVar12 + 0x3c0);
    lVar25 = lVar18 + 0xf;
  } while (lVar16 != 3);
  lVar16 = 0;
  lVar25 = 0;
  pvVar12 = __s;
  do {
    bVar6 = false;
    local_100 = 0;
    pvVar15 = pvVar12;
    local_a8 = lVar16;
    do {
      bVar7 = false;
      local_118 = 0;
      pvVar20 = pvVar15;
      do {
        bVar30 = false;
        uVar13 = 0;
        do {
          lVar16 = *(long *)((long)pvVar20 + uVar13 * 8);
          if (lVar16 != lVar25) {
            unaff_BPL = tfs::report_problem("Error",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                            ,"localTestMatrixSize",0x54,"value %lu != %lu",lVar16,
                                            lVar25);
            break;
          }
          lVar25 = lVar25 + 1;
          bVar30 = 0xd < uVar13;
          uVar13 = uVar13 + 1;
        } while (uVar13 != 0xf);
        if (!bVar30) break;
        bVar7 = 2 < local_118;
        local_118 = local_118 + 1;
        pvVar20 = (void *)((long)pvVar20 + 0x78);
      } while (local_118 != 4);
      if (!bVar7) break;
      pvVar15 = (void *)((long)pvVar15 + 0x1e0);
      bVar7 = local_100 == 0;
      bVar6 = !bVar7;
      local_100 = local_100 + 1;
    } while (bVar7);
    if (!bVar6) goto LAB_0010f03c;
    lVar16 = local_a8 + 1;
    pvVar12 = (void *)((long)pvVar12 + 0x3c0);
  } while (lVar16 != 3);
  operator_delete__(__s);
  goto LAB_0010f283;
code_r0x0010f007:
  plVar1 = (long *)((long)__s + uVar13);
  uVar13 = uVar13 + 8;
  if (*plVar1 != 0) goto LAB_0010f012;
  goto LAB_0010effe;
LAB_0010f012:
  unaff_BPL = tfs::report_problem("Error",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                  ,"localTestMatrixSize",0x27,"Data element not zero");
LAB_0010f03c:
  operator_delete__(__s);
  if ((unaff_BPL & 1) == 0) {
    return false;
  }
LAB_0010f283:
  aa_1.m_a = 3;
  aa_1.m_b = 1;
  aa_1.m_c = 1;
  aa_1.m_d = 1;
  aa_1.m_ab = 3;
  aa_1.m_abc = 3;
  aa_1.m_count = 3;
  aa_1.m_end = (double *)0x0;
  aa_1._56_16_ = ZEXT816(0x18);
  pdVar9 = (double *)operator_new__(0x18);
  aa_1.m_end = pdVar9 + 3;
  local_f8.m_a = 3;
  local_f8.m_b = 1;
  local_f8.m_c = 1;
  local_f8.m_d = 1;
  local_f8.m_ab = 3;
  local_f8.m_abc = 3;
  local_f8.m_count = 3;
  local_f8.m_data = (double *)0x0;
  local_f8.m_end = (double *)0x0;
  local_f8.m_length = 0x18;
  aa_1.m_data = pdVar9;
  local_f8.m_data = (double *)operator_new__(0x18);
  local_f8.m_end = local_f8.m_data + 3;
  *pdVar9 = 1.0;
  pdVar9[1] = 2.0;
  pdVar9[2] = 3.0;
  *local_f8.m_data = 4.0;
  local_f8.m_data[1] = -5.0;
  local_f8.m_data[2] = 6.0;
  dVar32 = 0.0;
  uVar13 = 0xfffffffffffffff8;
  do {
    dVar32 = dVar32 + *(double *)((long)pdVar9 + uVar13 + 8) *
                      *(double *)((long)local_f8.m_data + uVar13 + 8);
    uVar13 = uVar13 + 8;
  } while (uVar13 < 0x10);
  if ((dVar32 != 12.0) || (NAN(dVar32))) {
    pcVar19 = "dot product is not 12.0, it was %f";
    uVar14 = 0x6f;
LAB_0010f58f:
    bVar6 = tfs::report_problem("Error",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                ,"localTestMatrixMath",uVar14,pcVar19);
  }
  else {
    uVar13 = 0;
    dVar32 = 1.0;
    do {
      dVar36 = *(double *)((long)pdVar9 + uVar13 + 8);
      if (dVar32 <= dVar36) {
        dVar36 = dVar32;
      }
      uVar13 = uVar13 + 8;
      dVar32 = dVar36;
    } while (uVar13 < 0x10);
    if ((dVar36 != 1.0) || (NAN(dVar36))) {
      pcVar19 = "min is not 1.0, it was %f";
      uVar14 = 0x73;
      goto LAB_0010f58f;
    }
    uVar13 = 0;
    dVar32 = 1.0;
    do {
      dVar36 = *(double *)((long)pdVar9 + uVar13 + 8);
      if (dVar36 <= dVar32) {
        dVar36 = dVar32;
      }
      uVar13 = uVar13 + 8;
      dVar32 = dVar36;
    } while (uVar13 < 0x10);
    if ((dVar36 != 3.0) || (NAN(dVar36))) {
      pcVar19 = "max is not 3.0, it was %f";
      uVar14 = 0x77;
      goto LAB_0010f58f;
    }
    if ((((aa_1.m_data == (double *)0x0) || (aa_1.m_end <= aa_1.m_data)) || (aa_1.m_count == 0)) ||
       (aa_1.m_length == 0)) {
      tfs::report_problem("Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                          ,"sum",0x189,"empty matrix");
      dVar32 = 0.0;
    }
    else {
      dVar32 = *aa_1.m_data;
      pdVar9 = aa_1.m_data;
      while (pdVar9 = pdVar9 + 1, pdVar9 < aa_1.m_end) {
        dVar32 = dVar32 + *pdVar9;
      }
    }
    if ((dVar32 != 6.0) || (NAN(dVar32))) {
      pcVar19 = "sum is not 6.0, it was %f";
      uVar14 = 0x7b;
      goto LAB_0010f58f;
    }
    dVar32 = tfs::TMatrix<double>::min(&local_f8);
    if ((dVar32 != -5.0) || (NAN(dVar32))) {
      pcVar19 = "min is not -5.0, it was %f";
      uVar14 = 0x7f;
      goto LAB_0010f58f;
    }
    dVar32 = tfs::TMatrix<double>::max(&local_f8);
    if ((dVar32 != 6.0) || (NAN(dVar32))) {
      pcVar19 = "max is not 6.0, it was %f";
      uVar14 = 0x83;
      goto LAB_0010f58f;
    }
    dVar32 = tfs::TMatrix<double>::sum(&local_f8);
    if ((dVar32 != 5.0) || (NAN(dVar32))) {
      pcVar19 = "sum is not 5.0, it was %f";
      uVar14 = 0x87;
      goto LAB_0010f58f;
    }
    if ((local_f8.m_data != (double *)0x0) && (local_f8.m_length != 0)) {
      memset(local_f8.m_data,0,local_f8.m_length);
    }
    dVar32 = tfs::TMatrix<double>::min(&local_f8);
    if ((dVar32 != 0.0) || (NAN(dVar32))) {
      pcVar19 = "min is not 0.0, it was %f";
      uVar14 = 0x8c;
      goto LAB_0010f58f;
    }
    dVar32 = tfs::TMatrix<double>::max(&local_f8);
    if ((dVar32 != 0.0) || (NAN(dVar32))) {
      pcVar19 = "max is not 0.0, it was %f";
      uVar14 = 0x90;
      goto LAB_0010f58f;
    }
    tfs::TMatrix<double>::randomize(&aa_1);
    tfs::TMatrix<double>::randomize(&local_f8);
    dVar32 = tfs::TMatrix<double>::dot(&aa_1,&local_f8);
    bVar6 = true;
    if ((dVar32 == 12.0) && (!NAN(dVar32))) {
      tfs::report_problem("Warn ",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                          ,"localTestMatrixMath",0x96,
                          "dot product of two random matrices is 12.0, this is a surprise");
    }
  }
  if (local_f8.m_data != (double *)0x0) {
    operator_delete__(local_f8.m_data);
  }
  local_f8.m_data = (double *)0x0;
  local_f8.m_end = (double *)0x0;
  local_f8.m_count = 0;
  local_f8.m_length = 0;
  if (aa_1.m_data != (double *)0x0) {
    operator_delete__(aa_1.m_data);
  }
  aa_1.m_end = (double *)0x0;
  aa_1.m_count = 0;
  aa_1._56_16_ = ZEXT816(0);
  if (bVar6 == false) {
    return false;
  }
  pcVar19 = (char *)operator_new__(0x18);
  pcVar10 = (char *)operator_new__(0x18);
  pcVar19[0] = '\0';
  pcVar19[1] = '\0';
  pcVar19[2] = '\0';
  pcVar19[3] = '\0';
  pcVar19[4] = '\0';
  pcVar19[5] = '\0';
  pcVar19[6] = '\0';
  pcVar19[7] = '\0';
  pcVar19[8] = '\0';
  pcVar19[9] = '\0';
  pcVar19[10] = '\0';
  pcVar19[0xb] = '\0';
  pcVar19[0xc] = '\0';
  pcVar19[0xd] = '\0';
  pcVar19[0xe] = -0x10;
  pcVar19[0xf] = '?';
  pcVar19[0x10] = '\0';
  pcVar19[0x11] = '\0';
  pcVar19[0x12] = '\0';
  pcVar19[0x13] = '\0';
  pcVar19[0x14] = '\0';
  pcVar19[0x15] = '\0';
  pcVar19[0x16] = '\0';
  pcVar19[0x17] = '@';
  pcVar10[0] = '\0';
  pcVar10[1] = '\0';
  pcVar10[2] = '\0';
  pcVar10[3] = '\0';
  pcVar10[4] = '\0';
  pcVar10[5] = '\0';
  pcVar10[6] = '\0';
  pcVar10[7] = '\0';
  pcVar10[8] = '\0';
  pcVar10[9] = '\0';
  pcVar10[10] = '\0';
  pcVar10[0xb] = '\0';
  pcVar10[0xc] = '\0';
  pcVar10[0xd] = '\0';
  pcVar10[0xe] = -0x10;
  pcVar10[0xf] = '?';
  pcVar10[0x10] = '\0';
  pcVar10[0x11] = '\0';
  pcVar10[0x12] = '\0';
  pcVar10[0x13] = '\0';
  pcVar10[0x14] = '\0';
  pcVar10[0x15] = '\0';
  pcVar10[0x16] = '\0';
  pcVar10[0x17] = '@';
  auVar37[0] = -(*pcVar10 == *pcVar19);
  auVar37[1] = -(pcVar10[1] == pcVar19[1]);
  auVar37[2] = -(pcVar10[2] == pcVar19[2]);
  auVar37[3] = -(pcVar10[3] == pcVar19[3]);
  auVar37[4] = -(pcVar10[4] == pcVar19[4]);
  auVar37[5] = -(pcVar10[5] == pcVar19[5]);
  auVar37[6] = -(pcVar10[6] == pcVar19[6]);
  auVar37[7] = -(pcVar10[7] == pcVar19[7]);
  auVar37[8] = -(pcVar10[8] == pcVar19[8]);
  auVar37[9] = -(pcVar10[9] == pcVar19[9]);
  auVar37[10] = -(pcVar10[10] == pcVar19[10]);
  auVar37[0xb] = -(pcVar10[0xb] == pcVar19[0xb]);
  auVar37[0xc] = -(pcVar10[0xc] == pcVar19[0xc]);
  auVar37[0xd] = -(pcVar10[0xd] == pcVar19[0xd]);
  auVar37[0xe] = -(pcVar10[0xe] == pcVar19[0xe]);
  auVar37[0xf] = -(pcVar10[0xf] == pcVar19[0xf]);
  uVar2 = *(undefined8 *)(pcVar19 + 0x10);
  auVar34[0] = -((char)uVar2 == '\0');
  auVar34[1] = -((char)((ulong)uVar2 >> 8) == '\0');
  auVar34[2] = -((char)((ulong)uVar2 >> 0x10) == '\0');
  auVar34[3] = -((char)((ulong)uVar2 >> 0x18) == '\0');
  auVar34[4] = -((char)((ulong)uVar2 >> 0x20) == '\0');
  auVar34[5] = -((char)((ulong)uVar2 >> 0x28) == '\0');
  auVar34[6] = -((char)((ulong)uVar2 >> 0x30) == '\0');
  auVar34[7] = -((char)((ulong)uVar2 >> 0x38) == '@');
  auVar34[8] = 0xff;
  auVar34[9] = 0xff;
  auVar34[10] = 0xff;
  auVar34[0xb] = 0xff;
  auVar34[0xc] = 0xff;
  auVar34[0xd] = 0xff;
  auVar34[0xe] = 0xff;
  auVar34[0xf] = 0xff;
  auVar34 = auVar34 & auVar37;
  uVar14 = 0xa6;
  if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) == 0xffff) {
    dVar32 = 0.0;
    uVar13 = 0;
    do {
      dVar32 = dVar32 + *(double *)(pcVar19 + uVar13 + 8);
      uVar13 = uVar13 + 8;
    } while (uVar13 < 0x10);
    if ((dVar32 != 0.0) || (NAN(dVar32))) {
      uVar13 = 0xfffffffffffffff8;
      do {
        *(double *)(pcVar19 + uVar13 + 8) = *(double *)(pcVar19 + uVar13 + 8) / dVar32;
        uVar13 = uVar13 + 8;
      } while (uVar13 < 0x10);
    }
    pcVar10[8] = 'U';
    pcVar10[9] = 'U';
    pcVar10[10] = 'U';
    pcVar10[0xb] = 'U';
    pcVar10[0xc] = 'U';
    pcVar10[0xd] = 'U';
    pcVar10[0xe] = -0x2b;
    pcVar10[0xf] = '?';
    pcVar10[0x10] = 'U';
    pcVar10[0x11] = 'U';
    pcVar10[0x12] = 'U';
    pcVar10[0x13] = 'U';
    pcVar10[0x14] = 'U';
    pcVar10[0x15] = 'U';
    pcVar10[0x16] = -0x1b;
    pcVar10[0x17] = '?';
    auVar38[0] = -(*pcVar10 == *pcVar19);
    auVar38[1] = -(pcVar10[1] == pcVar19[1]);
    auVar38[2] = -(pcVar10[2] == pcVar19[2]);
    auVar38[3] = -(pcVar10[3] == pcVar19[3]);
    auVar38[4] = -(pcVar10[4] == pcVar19[4]);
    auVar38[5] = -(pcVar10[5] == pcVar19[5]);
    auVar38[6] = -(pcVar10[6] == pcVar19[6]);
    auVar38[7] = -(pcVar10[7] == pcVar19[7]);
    auVar38[8] = -(pcVar10[8] == pcVar19[8]);
    auVar38[9] = -(pcVar10[9] == pcVar19[9]);
    auVar38[10] = -(pcVar10[10] == pcVar19[10]);
    auVar38[0xb] = -(pcVar10[0xb] == pcVar19[0xb]);
    auVar38[0xc] = -(pcVar10[0xc] == pcVar19[0xc]);
    auVar38[0xd] = -(pcVar10[0xd] == pcVar19[0xd]);
    auVar38[0xe] = -(pcVar10[0xe] == pcVar19[0xe]);
    auVar38[0xf] = -(pcVar10[0xf] == pcVar19[0xf]);
    uVar2 = *(undefined8 *)(pcVar19 + 0x10);
    uVar3 = *(undefined8 *)(pcVar10 + 0x10);
    auVar40[0] = -((char)uVar3 == (char)uVar2);
    auVar40[1] = -((char)((ulong)uVar3 >> 8) == (char)((ulong)uVar2 >> 8));
    auVar40[2] = -((char)((ulong)uVar3 >> 0x10) == (char)((ulong)uVar2 >> 0x10));
    auVar40[3] = -((char)((ulong)uVar3 >> 0x18) == (char)((ulong)uVar2 >> 0x18));
    auVar40[4] = -((char)((ulong)uVar3 >> 0x20) == (char)((ulong)uVar2 >> 0x20));
    auVar40[5] = -((char)((ulong)uVar3 >> 0x28) == (char)((ulong)uVar2 >> 0x28));
    auVar40[6] = -((char)((ulong)uVar3 >> 0x30) == (char)((ulong)uVar2 >> 0x30));
    auVar40[7] = -((char)((ulong)uVar3 >> 0x38) == (char)((ulong)uVar2 >> 0x38));
    auVar40[8] = 0xff;
    auVar40[9] = 0xff;
    auVar40[10] = 0xff;
    auVar40[0xb] = 0xff;
    auVar40[0xc] = 0xff;
    auVar40[0xd] = 0xff;
    auVar40[0xe] = 0xff;
    auVar40[0xf] = 0xff;
    auVar40 = auVar40 & auVar38;
    uVar14 = 0xac;
    if ((ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) | (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar40[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0010f773;
    uVar13 = 0xfffffffffffffff8;
    do {
      *(double *)(pcVar19 + uVar13 + 8) = *(double *)(pcVar19 + uVar13 + 8) * 3.0;
      uVar13 = uVar13 + 8;
    } while (uVar13 < 0x10);
    uVar13 = 0xfffffffffffffff8;
    do {
      *(double *)(pcVar10 + uVar13 + 8) = *(double *)(pcVar10 + uVar13 + 8) / 0.3333333333333333;
      uVar13 = uVar13 + 8;
    } while (uVar13 < 0x10);
    auVar39[0] = -(*pcVar10 == *pcVar19);
    auVar39[1] = -(pcVar10[1] == pcVar19[1]);
    auVar39[2] = -(pcVar10[2] == pcVar19[2]);
    auVar39[3] = -(pcVar10[3] == pcVar19[3]);
    auVar39[4] = -(pcVar10[4] == pcVar19[4]);
    auVar39[5] = -(pcVar10[5] == pcVar19[5]);
    auVar39[6] = -(pcVar10[6] == pcVar19[6]);
    auVar39[7] = -(pcVar10[7] == pcVar19[7]);
    auVar39[8] = -(pcVar10[8] == pcVar19[8]);
    auVar39[9] = -(pcVar10[9] == pcVar19[9]);
    auVar39[10] = -(pcVar10[10] == pcVar19[10]);
    auVar39[0xb] = -(pcVar10[0xb] == pcVar19[0xb]);
    auVar39[0xc] = -(pcVar10[0xc] == pcVar19[0xc]);
    auVar39[0xd] = -(pcVar10[0xd] == pcVar19[0xd]);
    auVar39[0xe] = -(pcVar10[0xe] == pcVar19[0xe]);
    auVar39[0xf] = -(pcVar10[0xf] == pcVar19[0xf]);
    uVar2 = *(undefined8 *)(pcVar19 + 0x10);
    uVar3 = *(undefined8 *)(pcVar10 + 0x10);
    auVar41[0] = -((char)uVar3 == (char)uVar2);
    auVar41[1] = -((char)((ulong)uVar3 >> 8) == (char)((ulong)uVar2 >> 8));
    auVar41[2] = -((char)((ulong)uVar3 >> 0x10) == (char)((ulong)uVar2 >> 0x10));
    auVar41[3] = -((char)((ulong)uVar3 >> 0x18) == (char)((ulong)uVar2 >> 0x18));
    auVar41[4] = -((char)((ulong)uVar3 >> 0x20) == (char)((ulong)uVar2 >> 0x20));
    auVar41[5] = -((char)((ulong)uVar3 >> 0x28) == (char)((ulong)uVar2 >> 0x28));
    auVar41[6] = -((char)((ulong)uVar3 >> 0x30) == (char)((ulong)uVar2 >> 0x30));
    auVar41[7] = -((char)((ulong)uVar3 >> 0x38) == (char)((ulong)uVar2 >> 0x38));
    auVar41[8] = 0xff;
    auVar41[9] = 0xff;
    auVar41[10] = 0xff;
    auVar41[0xb] = 0xff;
    auVar41[0xc] = 0xff;
    auVar41[0xd] = 0xff;
    auVar41[0xe] = 0xff;
    auVar41[0xf] = 0xff;
    auVar41 = auVar41 & auVar39;
    uVar14 = 0xb1;
    if ((ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) | (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0010f773;
    operator_delete__(pcVar10);
    operator_delete__(pcVar19);
  }
  else {
LAB_0010f773:
    bVar6 = tfs::report_problem("Error",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                ,"localTestMatrixMath2",uVar14,"aa && bb matrices are not the same."
                               );
    operator_delete__(pcVar10);
    operator_delete__(pcVar19);
    if (!bVar6) {
      return false;
    }
  }
  aa_1.m_a = 3;
  aa_1.m_b = 2;
  aa_1.m_c = 1;
  aa_1.m_d = 1;
  aa_1.m_ab = 6;
  aa_1.m_abc = 6;
  aa_1.m_count = 6;
  aa_1.m_end = (double *)0x0;
  aa_1._56_16_ = ZEXT816(0x30);
  pdVar9 = (double *)operator_new__(0x30);
  aa_1.m_end = pdVar9 + 6;
  dVar32 = 0.0;
  uVar13 = 0xfffffffffffffff8;
  do {
    dVar32 = dVar32 + 1.0;
    *(double *)((long)pdVar9 + uVar13 + 8) = dVar32;
    uVar13 = uVar13 + 8;
  } while (uVar13 < 0x28);
  aa_1.m_data = pdVar9;
  tfs::TMatrix<double>::TMatrix(&local_f8,&aa_1,true);
  pdVar9 = local_f8.m_data;
  uVar14 = local_f8.m_length;
  pcVar19 = "aa && bb matrices are not the same.";
  uVar27 = 0xc4;
  if ((((aa_1.m_data == (double *)0x0) || (local_f8.m_data == (double *)0x0)) ||
      (aa_1.m_length != local_f8.m_length || aa_1.m_length == 0)) ||
     (((aa_1.m_a != local_f8.m_a || (aa_1.m_b != local_f8.m_b)) ||
      ((aa_1.m_c != local_f8.m_c ||
       ((aa_1.m_d != local_f8.m_d ||
        (iVar8 = bcmp(aa_1.m_data,local_f8.m_data,aa_1.m_length), iVar8 != 0)))))))) {
LAB_0010f90b:
    bVar6 = tfs::report_problem("Error",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                ,"localTestMatrixCopy",uVar27,pcVar19);
  }
  else {
    if ((uVar14 == 0 || local_f8.m_count == 0) || local_f8.m_end <= pdVar9) {
      tfs::report_problem("Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                          ,"randomize",0x5e,"empty matrix");
    }
    else {
      auVar35._8_4_ = (int)(local_f8.m_count >> 0x20);
      auVar35._0_8_ = local_f8.m_count;
      auVar35._12_4_ = 0x45300000;
      dVar36 = (auVar35._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_f8.m_count) - 4503599627370496.0);
      dVar32 = 1.0;
      if (1.0 <= dVar36) {
        dVar32 = dVar36;
      }
      dVar32 = 1.0 / dVar32;
      if (dVar32 < 0.0) {
        dVar32 = sqrt(dVar32);
        pdVar11 = local_f8.m_data;
        pdVar9 = local_f8.m_end;
      }
      else {
        dVar32 = SQRT(dVar32);
        pdVar11 = local_f8.m_data;
        pdVar9 = local_f8.m_end;
      }
      for (; pdVar11 < pdVar9; pdVar11 = pdVar11 + 1) {
        DVar33 = tfs::randomGauss();
        *pdVar11 = DVar33 * dVar32;
      }
    }
    pdVar9 = aa_1.m_data;
    if (((((aa_1.m_data != (double *)0x0) && (local_f8.m_data != (double *)0x0)) &&
         (aa_1.m_length != 0)) &&
        (((aa_1.m_length == local_f8.m_length && (aa_1.m_a == local_f8.m_a)) &&
         ((aa_1.m_b == local_f8.m_b && ((aa_1.m_c == local_f8.m_c && (aa_1.m_d == local_f8.m_d))))))
        )) && (iVar8 = bcmp(aa_1.m_data,local_f8.m_data,aa_1.m_length), iVar8 == 0)) {
      pcVar19 = "aa && bb matrices are the same.";
      uVar27 = 0xc9;
      goto LAB_0010f90b;
    }
    pdVar11 = (double *)operator_new__(0x30);
    bVar6 = aa_1.m_length == 0x30;
    if (bVar6 && pdVar9 != (double *)0x0) {
      dVar32 = *pdVar9;
      dVar36 = pdVar9[1];
      auVar34 = *(undefined1 (*) [16])(pdVar9 + 2);
      dVar4 = pdVar9[5];
      pdVar11[4] = pdVar9[4];
      pdVar11[5] = dVar4;
      *(undefined1 (*) [16])(pdVar11 + 2) = auVar34;
      *pdVar11 = dVar32;
      pdVar11[1] = dVar36;
    }
    if (((((pdVar9 == (double *)0x0) || (aa_1.m_length != 0x30)) || (aa_1.m_a != 1)) ||
        ((aa_1.m_b != 2 || (aa_1.m_c != 3)))) ||
       ((aa_1.m_d != 1 || (iVar8 = bcmp(pdVar9,pdVar11,0x30), iVar8 != 0)))) {
      __s2 = (double *)operator_new__(0x30);
      if (bVar6 && pdVar9 != (double *)0x0) {
        dVar32 = *pdVar9;
        dVar36 = pdVar9[1];
        auVar34 = *(undefined1 (*) [16])(pdVar9 + 2);
        dVar4 = pdVar9[5];
        __s2[4] = pdVar9[4];
        __s2[5] = dVar4;
        *(undefined1 (*) [16])(__s2 + 2) = auVar34;
        *__s2 = dVar32;
        __s2[1] = dVar36;
      }
      iVar8 = bcmp(pdVar11,__s2,0x30);
      if (iVar8 == 0) {
        bVar6 = true;
      }
      else {
        bVar6 = tfs::report_problem("Error",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                    ,"localTestMatrixCopy",0xd4,
                                    "cc && dd matrices are not the same.");
      }
      operator_delete__(__s2);
    }
    else {
      bVar6 = tfs::report_problem("Error",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                  ,"localTestMatrixCopy",0xcf,"aa && cc matrices are the same.");
    }
    operator_delete__(pdVar11);
  }
  if (local_f8.m_data != (double *)0x0) {
    operator_delete__(local_f8.m_data);
  }
  if (aa_1.m_data != (double *)0x0) {
    operator_delete__(aa_1.m_data);
  }
  if (bVar6 == false) {
    return false;
  }
  aa_1.m_a = 10;
  aa_1.m_b = 10;
  aa_1.m_c = 3;
  aa_1.m_d = 2;
  aa_1.m_ab = 100;
  aa_1.m_abc = 300;
  aa_1.m_count = 600;
  aa_1.m_end = (double *)0x0;
  aa_1._56_16_ = ZEXT816(0x12c0);
  pdVar9 = (double *)operator_new__(0x12c0);
  aa_1.m_data = pdVar9;
  aa_1.m_end = pdVar9 + 600;
  local_f8.m_a = 10;
  local_f8.m_b = 10;
  local_f8.m_c = 3;
  local_f8.m_d = 2;
  local_f8.m_ab = 100;
  local_f8.m_abc = 300;
  local_f8.m_count = 600;
  local_f8.m_data = (double *)0x0;
  local_f8.m_end = (double *)0x0;
  local_f8.m_length = 0x12c0;
  pdVar11 = (double *)operator_new__(0x12c0);
  local_f8.m_end = pdVar11 + 600;
  local_f8.m_data = pdVar11;
  tfs::fill(&aa_1);
  tfs::fill(&local_f8);
  iVar8 = bcmp(pdVar9,pdVar11,0x12c0);
  if (iVar8 == 0) {
    pdVar11[0x1c7] = 3.1415926;
    iVar8 = bcmp(pdVar9,pdVar11,0x12c0);
    if (iVar8 == 0) {
      pcVar19 = "matrices are different, but reporting as equal";
      uVar14 = 0xf9;
      goto LAB_0010fab6;
    }
    operator_delete__(pdVar11);
    local_f8.m_data = (double *)0x0;
    local_f8.m_end = (double *)0x0;
    local_f8.m_count = 0;
    local_f8.m_length = 0;
    operator_delete__(pdVar9);
  }
  else {
    pcVar19 = "matrices are equal, but reporting as different";
    uVar14 = 0xf5;
LAB_0010fab6:
    bVar6 = tfs::report_problem("Error",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                ,"localTestMatrixEqual",uVar14,pcVar19);
    operator_delete__(pdVar11);
    local_f8.m_data = (double *)0x0;
    local_f8.m_end = (double *)0x0;
    local_f8.m_count = 0;
    local_f8.m_length = 0;
    operator_delete__(pdVar9);
    if (!bVar6) {
      return false;
    }
  }
  aa_1.m_a = 4;
  aa_1.m_b = 4;
  aa_1.m_c = 3;
  aa_1.m_d = 1;
  aa_1.m_ab = 0x10;
  aa_1.m_abc = 0x30;
  aa_1.m_count = 0x30;
  aa_1.m_end = (double *)0x0;
  aa_1._56_16_ = ZEXT816(0x180);
  pdVar9 = (double *)operator_new__(0x180);
  aa_1.m_data = pdVar9;
  aa_1.m_end = pdVar9 + 0x30;
  local_f8.m_a = 2;
  local_f8.m_b = 2;
  local_f8.m_c = 3;
  local_f8.m_d = 1;
  local_f8.m_ab = 4;
  local_f8.m_abc = 0xc;
  local_f8.m_count = 0xc;
  local_f8.m_data = (double *)0x0;
  local_f8.m_end = (double *)0x0;
  local_f8.m_length = 0x60;
  local_f8.m_data = (double *)operator_new__(0x60);
  local_f8.m_end = local_f8.m_data + 0xc;
  tfs::fill(&aa_1);
  if ((local_f8.m_data != (double *)0x0) && (local_f8.m_length != 0)) {
    memset(local_f8.m_data,0,local_f8.m_length);
  }
  bVar6 = tfs::subsample(&local_f8,&aa_1,1,1);
  uVar5 = local_f8.m_c;
  uVar27 = local_f8.m_b;
  uVar14 = local_f8.m_a;
  if (bVar6) {
    bVar6 = local_f8.m_c != 0;
    bVar7 = bVar6;
    bVar30 = bVar6;
    if (bVar6) {
      bVar31 = local_f8.m_b != 0;
      bVar30 = true;
      uVar13 = 0;
      do {
        bVar29 = bVar31;
        if (uVar27 != 0) {
          lVar25 = 1;
          uVar26 = 0;
          do {
            local_a8 = CONCAT71(local_a8._1_7_,bVar29);
            uVar28 = uVar26 + 1;
            uVar22 = 0;
            while (uVar21 = uVar14, uVar14 != uVar22) {
              lVar16 = lVar25 * aa_1.m_a + aa_1.m_ab * uVar13;
              uVar21 = lVar16 + 1 + uVar22;
              if (aa_1.m_count <= uVar21) {
                tfs::report_problem("Error",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                                    ,"getIndex",0x96,
                                    "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu"
                                    ,uVar21,aa_1.m_count,uVar22 + 1,aa_1.m_a,uVar28,aa_1.m_b,uVar13,
                                    aa_1.m_c);
              }
              dVar32 = aa_1.m_data[lVar16 + uVar22 + 1];
              uVar21 = uVar26 * local_f8.m_a + local_f8.m_ab * uVar13 + uVar22;
              if (local_f8.m_count <= uVar21) {
                tfs::report_problem("Error",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                                    ,"getIndex",0x96,
                                    "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu"
                                    ,uVar21,local_f8.m_count,uVar22,local_f8.m_a,uVar26,local_f8.m_b
                                    ,uVar13,local_f8.m_c);
              }
              dVar36 = local_f8.m_data[uVar21];
              if ((dVar32 != dVar36) || (NAN(dVar32) || NAN(dVar36))) {
                bVar7 = tfs::report_problem("Error",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                            ,"localTestMatrixSubsample",0x114,
                                            "Values do not match: %f/%f, %lu, %lu, %lu",uVar22,
                                            uVar26,uVar13);
              }
              uVar21 = uVar22;
              if ((dVar32 != dVar36) || (uVar22 = uVar22 + 1, NAN(dVar32) || NAN(dVar36))) break;
            }
            if (uVar21 < uVar14) {
              bVar29 = (byte)local_a8;
              break;
            }
            lVar25 = lVar25 + 1;
            bVar29 = uVar28 < uVar27;
            uVar26 = uVar28;
          } while (uVar28 != uVar27);
        }
        if ((bVar29 & 1) != 0) break;
        uVar13 = uVar13 + 1;
        bVar30 = uVar13 < uVar5;
      } while (uVar13 != uVar5);
    }
    if (bVar30) goto LAB_001103b8;
    bVar30 = tfs::subsample(&local_f8,&aa_1,1,2);
    if (bVar30) {
      if (uVar5 != 0) {
        bVar6 = true;
        uVar13 = 0;
        do {
          bVar29 = uVar27 != 0;
          if (uVar27 != 0) {
            lVar25 = 2;
            uVar26 = 0;
            do {
              local_a8 = CONCAT71(local_a8._1_7_,bVar29);
              uVar28 = 0;
              while (uVar22 = uVar14, uVar14 != uVar28) {
                lVar16 = lVar25 * aa_1.m_a + aa_1.m_ab * uVar13;
                uVar22 = uVar28 + lVar16 + 1;
                if (aa_1.m_count <= uVar22) {
                  tfs::report_problem("Error",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                                      ,"getIndex",0x96,
                                      "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu"
                                      ,uVar22,aa_1.m_count,uVar28 + 1,aa_1.m_a,uVar26 + 2,aa_1.m_b,
                                      uVar13,aa_1.m_c);
                }
                dVar32 = aa_1.m_data[lVar16 + uVar28 + 1];
                uVar22 = uVar26 * local_f8.m_a + local_f8.m_ab * uVar13 + uVar28;
                if (local_f8.m_count <= uVar22) {
                  tfs::report_problem("Error",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                                      ,"getIndex",0x96,
                                      "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu"
                                      ,uVar22,local_f8.m_count,uVar28,local_f8.m_a,uVar26,
                                      local_f8.m_b,uVar13,local_f8.m_c);
                }
                dVar36 = local_f8.m_data[uVar22];
                if ((dVar32 != dVar36) || (NAN(dVar32) || NAN(dVar36))) {
                  bVar7 = tfs::report_problem("Error",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                              ,"localTestMatrixSubsample",0x124,
                                              "Values do not match: %f/%f, %lu, %lu, %lu",uVar28,
                                              uVar26,uVar13);
                }
                uVar22 = uVar28;
                if ((dVar32 != dVar36) || (uVar28 = uVar28 + 1, NAN(dVar32) || NAN(dVar36))) break;
              }
              if (uVar22 < uVar14) {
                bVar29 = (byte)local_a8;
                break;
              }
              uVar26 = uVar26 + 1;
              lVar25 = lVar25 + 1;
              bVar29 = uVar26 < uVar27;
            } while (uVar26 != uVar27);
          }
          if ((bVar29 & 1) != 0) break;
          uVar13 = uVar13 + 1;
          bVar6 = uVar13 < uVar5;
        } while (uVar13 != uVar5);
      }
      if (bVar6) goto LAB_001103b8;
      bVar6 = tfs::subsample(&local_f8,&aa_1,0,0);
      if (bVar6) {
        if (uVar5 != 0) {
          local_a8 = CONCAT71(local_a8._1_7_,uVar14 != 0);
          uVar13 = 0;
          do {
            bVar6 = uVar27 != 0;
            if (uVar27 != 0) {
              uVar26 = 0;
              do {
                bVar29 = (byte)local_a8;
                if (uVar14 != 0) {
                  uVar28 = 0;
                  do {
                    uVar22 = uVar26 * aa_1.m_a + aa_1.m_ab * uVar13 + uVar28;
                    if (aa_1.m_count <= uVar22) {
                      tfs::report_problem("Error",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                                          ,"getIndex",0x96,
                                          "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu"
                                          ,uVar22,aa_1.m_count,uVar28,aa_1.m_a,uVar26,aa_1.m_b,
                                          uVar13,aa_1.m_c);
                    }
                    dVar32 = aa_1.m_data[uVar22];
                    uVar22 = uVar26 * local_f8.m_a + local_f8.m_ab * uVar13 + uVar28;
                    if (local_f8.m_count <= uVar22) {
                      tfs::report_problem("Error",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                                          ,"getIndex",0x96,
                                          "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu"
                                          ,uVar22,local_f8.m_count,uVar28,local_f8.m_a,uVar26,
                                          local_f8.m_b,uVar13,local_f8.m_c);
                    }
                    dVar36 = local_f8.m_data[uVar22];
                    if ((dVar32 != dVar36) || (NAN(dVar32) || NAN(dVar36))) {
                      bVar7 = tfs::report_problem("Error",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                                                  ,"localTestMatrixSubsample",0x134,
                                                  "Values do not match: %f/%f, %lu, %lu, %lu",uVar28
                                                  ,uVar26,uVar13);
                    }
                    if ((dVar32 != dVar36) || (NAN(dVar32) || NAN(dVar36))) break;
                    uVar28 = uVar28 + 1;
                    bVar29 = uVar28 < uVar14;
                  } while (uVar28 != uVar14);
                }
                if ((bVar29 & 1) != 0) break;
                uVar26 = uVar26 + 1;
                bVar6 = uVar26 < uVar27;
              } while (uVar26 != uVar27);
            }
            if (bVar6) goto LAB_001103b8;
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar5);
        }
        bVar7 = true;
        goto LAB_001103b8;
      }
    }
  }
  bVar7 = false;
LAB_001103b8:
  if (local_f8.m_data != (double *)0x0) {
    operator_delete__(local_f8.m_data);
  }
  local_f8.m_data = (double *)0x0;
  local_f8.m_end = (double *)0x0;
  local_f8.m_count = 0;
  local_f8.m_length = 0;
  if (aa_1.m_data != (double *)0x0) {
    operator_delete__(aa_1.m_data);
  }
  aa_1.m_end = (double *)0x0;
  aa_1.m_count = 0;
  aa_1.m_length = 0;
  if (bVar7 == false) {
    return false;
  }
  tfs::report_message("Info ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/TestMatrix.cpp"
                      ,"localTestMatrix",0x152,"Test Matrix - End");
  return true;
}

Assistant:

static bool
    localTestMatrix( void ) {
        log_info( "Test Matrix - Start" );
        if( !localTestMatrixSize()) {
            return false;
        }
        if( !localTestMatrixMath()) {
            return false;
        }
        if( !localTestMatrixMath2()) {
            return false;
        }
        if( !localTestMatrixCopy()) {
            return false;
        }
        if( !localTestMatrixEqual()) {
            return false;
        }
        if( !localTestMatrixSubsample()) {
            return false;
        }
        log_info( "Test Matrix - End" );
        return true;
    }